

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expression.h
# Opt level: O2

size_t __thiscall
lossless_neural_sound::expression_compiler::expression::Expression_node::get_tree_index
          (Expression_node *this)

{
  Expression_node *pEVar1;
  bool bVar2;
  long lVar3;
  size_t sVar4;
  
  pEVar1 = (this->aa_tree_node).left_child;
  if (pEVar1 == (Expression_node *)0x0) {
    sVar4 = 0;
  }
  else {
    sVar4 = (pEVar1->aa_tree_node).tree_size;
  }
  while( true ) {
    if ((this->aa_tree_node).parent == (Expression_node *)0x0) {
      return sVar4;
    }
    bVar2 = AA_tree_node::is_valid(&this->aa_tree_node);
    if (!bVar2) break;
    pEVar1 = (this->aa_tree_node).parent;
    bVar2 = this == (pEVar1->aa_tree_node).right_child;
    this = pEVar1;
    if (bVar2) {
      pEVar1 = (pEVar1->aa_tree_node).left_child;
      lVar3 = 1;
      if (pEVar1 != (Expression_node *)0x0) {
        lVar3 = (pEVar1->aa_tree_node).tree_size + 1;
      }
      sVar4 = sVar4 + lVar3;
    }
  }
  __assert_fail("node->aa_tree_node.is_valid()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/programmerjake[P]lossless_neural_sound/src/expression_compiler/expression.h"
                ,0xf1,
                "std::size_t lossless_neural_sound::expression_compiler::expression::Expression_node::get_tree_index() const"
               );
}

Assistant:

std::size_t get_tree_index() const noexcept
    {
        std::size_t retval = get_tree_size(aa_tree_node.left_child);
        const Expression_node *node = this;
        while(node->aa_tree_node.parent)
        {
            assert(node->aa_tree_node.is_valid());
            auto *parent = node->aa_tree_node.parent;
            if(node == parent->aa_tree_node.right_child)
                retval += 1 + get_tree_size(parent->aa_tree_node.left_child);
            node = parent;
        }
        return retval;
    }